

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O0

int skeinMacInit(SkeinCtx_t *ctx,uint8_t *key,size_t keyLen,size_t hashBitLen)

{
  ulong uVar1;
  u64b_t uVar2;
  uint64_t treeInfo;
  size_t Xlen;
  u64b_t *X;
  int ret;
  size_t hashBitLen_local;
  size_t keyLen_local;
  uint8_t *key_local;
  SkeinCtx_t *ctx_local;
  
  X._4_4_ = 1;
  if (ctx == (SkeinCtx_t *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    uVar1 = ctx->skeinSize;
    if (hashBitLen == 0) {
      ctx_local._4_4_ = 2;
    }
    else {
      uVar2 = ctx->skeinSize;
      if (uVar2 == 0x100) {
        X._4_4_ = Skein_256_InitExt(&(ctx->m).s256,hashBitLen,0,key,keyLen);
      }
      else if (uVar2 == 0x200) {
        X._4_4_ = Skein_512_InitExt(&(ctx->m).s512,hashBitLen,0,key,keyLen);
      }
      else if (uVar2 == 0x400) {
        X._4_4_ = Skein1024_InitExt(&(ctx->m).s1024,hashBitLen,0,key,keyLen);
      }
      if (X._4_4_ == 0) {
        memcpy(ctx->XSave,(void *)((long)&ctx->m + 0x20),uVar1 >> 3);
      }
      ctx_local._4_4_ = X._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int skeinMacInit(SkeinCtx_t* ctx, const uint8_t *key, size_t keyLen,
                 size_t hashBitLen)
{
    int ret = SKEIN_FAIL;
    u64b_t*  X = NULL;
    size_t Xlen = 0;
    uint64_t treeInfo = SKEIN_CFG_TREE_INFO_SEQUENTIAL;

    Skein_Assert(ctx, SKEIN_FAIL);

    X = ctx->m.s256.X;
    Xlen = ctx->skeinSize/8;

    Skein_Assert(hashBitLen, SKEIN_BAD_HASHLEN);

    switch (ctx->skeinSize) {
    case Skein256:
        ret = Skein_256_InitExt(&ctx->m.s256, hashBitLen,
                                treeInfo,
                                (const u08b_t*)key, keyLen);

        break;
    case Skein512:
        ret = Skein_512_InitExt(&ctx->m.s512, hashBitLen,
                                treeInfo,
                                (const u08b_t*)key, keyLen);
        break;
    case Skein1024:
        ret = Skein1024_InitExt(&ctx->m.s1024, hashBitLen,
                                treeInfo,
                                (const u08b_t*)key, keyLen);

        break;
    }
    if (ret == SKEIN_SUCCESS) {
        /* Save chaining variables for this combination of key, keyLen, hashBitLen */
        memcpy(ctx->XSave, X, Xlen);
    }
    return ret;
}